

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool __thiscall ON_Font::SetFamilyName(ON_Font *this,wchar_t *family_name)

{
  ON_wString *this_00;
  bool bVar1;
  wchar_t *string1;
  wchar_t *string2;
  bool bVar2;
  ON_wString *src;
  ON_wString local_family_name;
  ON_wString local_40;
  
  FamilyNameFromDirtyName((ON_Font *)&stack0xffffffffffffffc8,family_name);
  ON_wString::TrimLeftAndRight((ON_wString *)&stack0xffffffffffffffc8,(wchar_t *)0x0);
  string1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffc8);
  this_00 = &this->m_loc_family_name;
  bVar1 = ON_wString::IsNotEmpty(this_00);
  src = &this->m_en_family_name;
  if (bVar1) {
    src = this_00;
  }
  ON_wString::ON_wString(&local_40,src);
  string2 = ON_wString::operator_cast_to_wchar_t_(&local_40);
  bVar1 = ON_wString::EqualOrdinal(string1,string2,false);
  ON_wString::~ON_wString(&local_40);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2d08);
    if (bVar1) {
      Internal_ClearName(this,true,true,true,true);
      this->m_logfont_charset = '\x01';
      ON_wString::operator=(this_00,string1);
      ON_wString::operator=(&this->m_en_family_name,this_00);
      Internal_AfterModification(this);
    }
    else {
      bVar2 = false;
    }
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc8);
  return bVar2;
}

Assistant:

bool ON_Font::SetFamilyName(
  const wchar_t* family_name
)
{
  ON_wString local_family_name = ON_Font::FamilyNameFromDirtyName(family_name);
  local_family_name.TrimLeftAndRight();
  family_name = local_family_name;

  if ( ON_wString::EqualOrdinal(family_name, FamilyName(), false) )
  {
    return true;
  }

  if ( false == ON_FONT_MODIFICATION_PERMITTED )
    return false;  
  
  Internal_ClearName(true, true, true, true);
  
  m_logfont_charset = ON_Font::WindowsConstants::logfont_default_charset;

  m_loc_family_name = family_name;  
  m_en_family_name = m_loc_family_name;  

  Internal_AfterModification();
  return true;
}